

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePath.cxx
# Opt level: O1

bool __thiscall cmCMakePath::IsPrefix(cmCMakePath *this,cmCMakePath *path)

{
  _List *p_Var1;
  _List *p_Var2;
  byte bVar3;
  long lVar4;
  bool bVar5;
  int iVar6;
  path *ppVar7;
  long lVar8;
  path *ppVar9;
  path *ppVar10;
  bool bVar11;
  bool bVar12;
  bool local_5c;
  bool local_4c;
  path *local_48;
  long local_40;
  
  p_Var1 = &(this->Path)._M_cmpts;
  if ((*(byte *)&(this->Path)._M_cmpts._M_impl._M_t.
                 super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                 .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
                 _M_head_impl & 3) == 0) {
    ppVar7 = (path *)std::filesystem::__cxx11::path::_List::begin();
    bVar11 = false;
  }
  else {
    bVar11 = (this->Path)._M_pathname._M_string_length == 0;
    ppVar7 = (path *)0x0;
  }
  local_5c = (*(byte *)&(p_Var1->_M_impl)._M_t.
                        super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                        .
                        super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>
                        ._M_head_impl & 3) == 0;
  if (local_5c) {
    local_48 = (path *)std::filesystem::__cxx11::path::_List::end();
  }
  else {
    local_48 = (path *)0x0;
  }
  local_5c = !local_5c;
  p_Var2 = &(path->Path)._M_cmpts;
  if ((*(byte *)&(path->Path)._M_cmpts._M_impl._M_t.
                 super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                 .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
                 _M_head_impl & 3) == 0) {
    lVar8 = std::filesystem::__cxx11::path::_List::begin();
    bVar12 = false;
  }
  else {
    bVar12 = (path->Path)._M_pathname._M_string_length == 0;
    lVar8 = 0;
  }
  local_4c = (*(byte *)&(p_Var2->_M_impl)._M_t.
                        super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                        .
                        super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>
                        ._M_head_impl & 3) == 0;
  if (local_4c) {
    local_40 = std::filesystem::__cxx11::path::_List::end();
  }
  else {
    local_40 = 0;
  }
  local_4c = !local_4c;
  bVar5 = bVar11 != local_5c;
  if ((*(byte *)&(p_Var1->_M_impl)._M_t.
                 super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                 .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
                 _M_head_impl & 3) == 0) {
    bVar5 = ppVar7 != local_48;
  }
  ppVar10 = ppVar7;
  if (bVar5) {
    do {
      bVar5 = bVar12 != local_4c;
      if ((*(byte *)&(p_Var2->_M_impl)._M_t.
                     super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                     .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
                     _M_head_impl & 3) == 0) {
        bVar5 = lVar8 != local_40;
      }
      ppVar10 = ppVar7;
      if (!bVar5) break;
      ppVar9 = &this->Path;
      if ((*(byte *)&(this->Path)._M_cmpts._M_impl._M_t.
                     super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                     .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
                     _M_head_impl & 3) == 0) {
        ppVar9 = ppVar7;
      }
      iVar6 = std::filesystem::__cxx11::path::compare(ppVar9);
      if (iVar6 != 0) break;
      bVar3 = *(byte *)&(p_Var1->_M_impl)._M_t.
                        super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                        .
                        super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>
                        ._M_head_impl;
      ppVar10 = (path *)&(((path *)&ppVar7[1]._M_pathname)->_M_pathname)._M_string_length;
      if ((bVar3 & 3) != 0) {
        bVar11 = true;
        ppVar10 = ppVar7;
      }
      bVar5 = bVar11 != local_5c;
      if ((bVar3 & 3) == 0) {
        bVar5 = ppVar10 != local_48;
      }
      lVar4 = lVar8 + 0x30;
      if ((*(byte *)&(p_Var2->_M_impl)._M_t.
                     super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                     .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
                     _M_head_impl & 3) != 0) {
        bVar12 = true;
        lVar4 = lVar8;
      }
      lVar8 = lVar4;
      ppVar7 = ppVar10;
    } while (bVar5);
  }
  bVar11 = bVar11 == local_5c;
  if ((*(byte *)&(p_Var1->_M_impl)._M_t.
                 super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                 .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
                 _M_head_impl & 3) == 0) {
    bVar11 = ppVar10 == local_48;
  }
  bVar5 = true;
  if (!bVar11) {
    if ((*(byte *)&(this->Path)._M_cmpts._M_impl._M_t.
                   super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                   .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
                   _M_head_impl & 3) != 0) {
      ppVar10 = &this->Path;
    }
    if ((((path *)&ppVar10->_M_pathname)->_M_pathname)._M_string_length == 0) {
      bVar5 = bVar12 != local_4c;
      if ((*(byte *)&(p_Var2->_M_impl)._M_t.
                     super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                     .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
                     _M_head_impl & 3) == 0) {
        bVar5 = lVar8 != local_40;
      }
    }
    else {
      bVar5 = false;
    }
  }
  return bVar5;
}

Assistant:

bool cmCMakePath::IsPrefix(const cmCMakePath& path) const
{
  auto prefix_it = this->Path.begin();
  auto prefix_end = this->Path.end();
  auto path_it = path.Path.begin();
  auto path_end = path.Path.end();

  while (prefix_it != prefix_end && path_it != path_end &&
         *prefix_it == *path_it) {
    ++prefix_it;
    ++path_it;
  }
  return (prefix_it == prefix_end) ||
    (prefix_it->empty() && path_it != path_end);
}